

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

NameSyntax *
slang::ast::anon_unknown_39::splitScopedName
          (ScopedNameSyntax *syntax,
          SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *nameParts,int *colonParts
          )

{
  ulong uVar1;
  int iVar2;
  pointer pNVar3;
  undefined1 *puVar4;
  pointer pNVar5;
  long lVar6;
  pointer pNVar7;
  ulong uVar8;
  size_type sVar9;
  NameComponents *pNVar10;
  pointer pNVar11;
  pointer pNVar12;
  pointer __src;
  pointer pNVar13;
  byte bVar14;
  NameComponents local_78;
  SourceLocation local_40;
  SyntaxKind local_38;
  
  bVar14 = 0;
  do {
    NameComponents::NameComponents(&local_78,(syntax->right).ptr);
    local_40 = parsing::Token::location(&syntax->separator);
    local_38 = (((syntax->right).ptr)->super_ExpressionSyntax).super_SyntaxNode.kind;
    uVar1 = nameParts->len;
    __src = nameParts->data_ + uVar1;
    if (uVar1 == nameParts->cap) {
      if (-uVar1 == -0x1c71c71c71c71c7) {
        slang::detail::throwLengthError();
      }
      uVar8 = uVar1 + 1;
      if (uVar1 + 1 < uVar1 * 2) {
        uVar8 = uVar1 * 2;
      }
      if (-uVar1 + 0x1c71c71c71c71c7 < uVar1) {
        uVar8 = 0x1c71c71c71c71c7;
      }
      pNVar3 = (pointer)operator_new(uVar8 * 0x48);
      pNVar10 = &local_78;
      pNVar12 = pNVar3 + uVar1;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pNVar12->name).text._M_len = (pNVar10->text)._M_len;
        pNVar10 = (NameComponents *)((long)pNVar10 + ((ulong)bVar14 * -2 + 1) * 8);
        pNVar12 = (pointer)((long)pNVar12 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      pNVar12 = nameParts->data_;
      sVar9 = nameParts->len;
      puVar4 = (undefined1 *)((long)pNVar12 + (sVar9 * 0x48 - (long)__src));
      pNVar5 = pNVar12;
      pNVar7 = pNVar3;
      if (puVar4 == (undefined1 *)0x0) {
        pNVar5 = pNVar3;
        pNVar7 = pNVar12;
        if (sVar9 != 0) {
          do {
            pNVar11 = pNVar7;
            pNVar13 = pNVar5;
            for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pNVar13->name).text._M_len = (pNVar11->name).text._M_len;
              pNVar11 = (pointer)((long)pNVar11 + ((ulong)bVar14 * -2 + 1) * 8);
              pNVar13 = (pointer)((long)pNVar13 + ((ulong)bVar14 * -2 + 1) * 8);
            }
            pNVar7 = pNVar7 + 1;
            pNVar5 = pNVar5 + 1;
          } while (pNVar7 != __src);
        }
      }
      else {
        for (; pNVar5 != __src; pNVar5 = pNVar5 + 1) {
          pNVar11 = pNVar5;
          pNVar13 = pNVar7;
          for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pNVar13->name).text._M_len = (pNVar11->name).text._M_len;
            pNVar11 = (pointer)((long)pNVar11 + ((ulong)bVar14 * -2 + 1) * 8);
            pNVar13 = (pointer)((long)pNVar13 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          pNVar7 = pNVar7 + 1;
        }
        memcpy(pNVar3 + uVar1 + 1,__src,((ulong)(puVar4 + -0x48) / 0x48) * 0x48 + 0x48);
      }
      if (pNVar12 != (pointer)nameParts->firstElement) {
        operator_delete(pNVar12);
        sVar9 = nameParts->len;
      }
      nameParts->len = sVar9 + 1;
      nameParts->cap = uVar8;
      nameParts->data_ = pNVar3;
    }
    else {
      pNVar10 = &local_78;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        (__src->name).text._M_len = (pNVar10->text)._M_len;
        pNVar10 = (NameComponents *)((long)pNVar10 + (ulong)bVar14 * -0x10 + 8);
        __src = (pointer)((long)__src + ((ulong)bVar14 * -2 + 1) * 8);
      }
      nameParts->len = nameParts->len + 1;
    }
    iVar2 = *colonParts + 1;
    if ((syntax->separator).kind == Dot) {
      iVar2 = 0;
    }
    *colonParts = iVar2;
    syntax = (ScopedNameSyntax *)(syntax->left).ptr;
  } while ((syntax->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName);
  return &syntax->super_NameSyntax;
}

Assistant:

const NameSyntax* splitScopedName(const ScopedNameSyntax& syntax,
                                  SmallVectorBase<NamePlusLoc>& nameParts, int& colonParts) {
    // Split the name into easier to manage chunks. The parser will always produce a
    // left-recursive name tree, so that's all we'll bother to handle.
    const ScopedNameSyntax* scoped = &syntax;
    while (true) {
        nameParts.push_back({*scoped->right, scoped->separator.location(), scoped->right->kind});
        if (scoped->separator.kind == TokenKind::Dot)
            colonParts = 0;
        else
            colonParts++;

        if (scoped->left->kind != SyntaxKind::ScopedName)
            break;

        scoped = &scoped->left->as<ScopedNameSyntax>();
    }
    return scoped->left;
}